

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderMaxOutputVerticesTest::iterate(GeometryShaderMaxOutputVerticesTest *this)

{
  int iVar1;
  deUint32 err;
  NotSupportedError *this_00;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  MessageBuilder local_700;
  MessageBuilder local_580;
  byte local_3fa;
  byte local_3f9;
  bool does_invalid_build;
  char *pcStack_3f8;
  bool does_valid_build;
  GLchar *geometry_shader_invalid_parts [3];
  char *local_3d8;
  GLchar *geometry_shader_valid_parts [3];
  stringstream local_3a0 [8];
  stringstream stream_invalid;
  undefined1 local_390 [376];
  string local_218 [32];
  stringstream local_1f8 [8];
  stringstream stream_valid;
  undefined1 local_1e8 [376];
  string local_70 [8];
  string invalid_output_vertices_string;
  string valid_output_vertices_string;
  GLint max_output_vertices;
  Functions *gl;
  GeometryShaderMaxOutputVerticesTest *this_local;
  
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
               ,0x7d8);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  std::__cxx11::string::string((string *)(invalid_output_vertices_string.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_70);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_OUTPUT_VERTICES,
             (undefined1 *)((long)&valid_output_vertices_string.field_2 + 0xc));
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glGetIntegerv() call failed for GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x7e4);
  std::__cxx11::stringstream::stringstream(local_1f8);
  std::ostream::operator<<(local_1e8,valid_output_vertices_string.field_2._12_4_);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=
            ((string *)(invalid_output_vertices_string.field_2._M_local_buf + 8),local_218);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::stringstream::stringstream(local_3a0);
  std::ostream::operator<<(local_390,valid_output_vertices_string.field_2._12_4_ + 1);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=(local_70,(string *)(geometry_shader_valid_parts + 2));
  std::__cxx11::string::~string((string *)(geometry_shader_valid_parts + 2));
  local_3d8 = 
  "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\n// definition of NUMBER_OF_POINTS goes here\n#define NUMBER_OF_POINTS "
  ;
  geometry_shader_valid_parts[0] = (GLchar *)std::__cxx11::string::c_str();
  geometry_shader_valid_parts[1] =
       "u\n\nlayout(points)                                in;\nlayout(points, max_vertices=NUMBER_OF_POINTS) out;\n\nvoid main()\n{\n    int index = 0;\n\n    for (uint point = 0u; point < NUMBER_OF_POINTS; ++point)\n    {\n        EmitVertex();\n        EndPrimitive();\n    }\n\n}\n"
  ;
  pcStack_3f8 = 
  "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\n// definition of NUMBER_OF_POINTS goes here\n#define NUMBER_OF_POINTS "
  ;
  geometry_shader_invalid_parts[0] = (GLchar *)std::__cxx11::string::c_str();
  geometry_shader_invalid_parts[1] =
       "u\n\nlayout(points)                                in;\nlayout(points, max_vertices=NUMBER_OF_POINTS) out;\n\nvoid main()\n{\n    int index = 0;\n\n    for (uint point = 0u; point < NUMBER_OF_POINTS; ++point)\n    {\n        EmitVertex();\n        EndPrimitive();\n    }\n\n}\n"
  ;
  local_3f9 = TestCaseBase::doesProgramBuild
                        (&this->super_TestCaseBase,1,&m_fragment_shader_code,3,&local_3d8,1,
                         &m_vertex_shader_code);
  local_3fa = TestCaseBase::doesProgramBuild
                        (&this->super_TestCaseBase,1,&m_fragment_shader_code,3,
                         &stack0xfffffffffffffc08,1,&m_vertex_shader_code);
  if (((local_3f9 & 1) != 1) || ((bool)local_3fa)) {
    if ((local_3f9 & 1) != 1) {
      pTVar3 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_580,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_580,
                          (char (*) [86])
                          "Failed to build valid program! GS::max_vertices set to MAX_GEOMETRY_OUTPUT_VERTICES.\n"
                         );
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_580);
    }
    if ((local_3fa & 1) != 0) {
      pTVar3 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_700,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_700,
                          (char (*) [100])
                          "Build of invalid program was successful! GS::max_vertices set to MAX_GEOMETRY_OUTPUT_VERTICES + 1.\n"
                         );
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_700);
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  std::__cxx11::stringstream::~stringstream(local_3a0);
  std::__cxx11::stringstream::~stringstream(local_1f8);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)(invalid_output_vertices_string.field_2._M_local_buf + 8))
  ;
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult GeometryShaderMaxOutputVerticesTest::iterate()
{
	/* This test should only run if EXT_geometry_shader is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* GL */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get maximum number of output vertices and prepare strings */
	glw::GLint  max_output_vertices;
	std::string valid_output_vertices_string;
	std::string invalid_output_vertices_string;

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_OUTPUT_VERTICES, &max_output_vertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT pname");

	std::stringstream stream_valid;
	stream_valid << max_output_vertices;
	valid_output_vertices_string = stream_valid.str();

	std::stringstream stream_invalid;
	stream_invalid << max_output_vertices + 1;
	invalid_output_vertices_string = stream_invalid.str();

	/* Geometry shader parts */
	const glw::GLchar* geometry_shader_valid_parts[] = { m_geometry_shader_code_preamble,
														 valid_output_vertices_string.c_str(),
														 m_geometry_shader_code_body };

	const glw::GLchar* geometry_shader_invalid_parts[] = { m_geometry_shader_code_preamble,
														   invalid_output_vertices_string.c_str(),
														   m_geometry_shader_code_body };

	/* Try to build programs */
	bool does_valid_build =
		doesProgramBuild(1, &m_fragment_shader_code, 3, geometry_shader_valid_parts, 1, &m_vertex_shader_code);

	bool does_invalid_build =
		doesProgramBuild(1, &m_fragment_shader_code, 3, geometry_shader_invalid_parts, 1, &m_vertex_shader_code);

	/* Verify results */
	if ((true == does_valid_build) && (false == does_invalid_build))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (true != does_valid_build)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Failed to build valid program! GS::max_vertices "
														   "set to MAX_GEOMETRY_OUTPUT_VERTICES.\n"
							   << tcu::TestLog::EndMessage;
		}

		if (false != does_invalid_build)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Build of invalid program was successful! GS::max_vertices "
														   "set to MAX_GEOMETRY_OUTPUT_VERTICES + 1.\n"
							   << tcu::TestLog::EndMessage;
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}